

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void CompareOnTheFlyMaterial(comparer_context *comp)

{
  scoped_chunk this;
  bool bVar1;
  Chunk *pCVar2;
  undefined1 local_80 [8];
  sliced_chunk_iterator it;
  sliced_chunk_reader reader;
  allocator<char> local_39;
  string local_38;
  scoped_chunk local_18;
  scoped_chunk chunk;
  comparer_context *comp_local;
  
  chunk.ctx = comp;
  scoped_chunk::scoped_chunk(&local_18,comp,"aiMaterial");
  this.ctx = chunk.ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"aiMaterial::mNumProperties",&local_39);
  comparer_context::cmp<unsigned_int>(this.ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  sliced_chunk_reader::sliced_chunk_reader((sliced_chunk_reader *)&it.end,chunk.ctx);
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_80,(sliced_chunk_reader *)&it.end);
  while( true ) {
    bVar1 = sliced_chunk_iterator::is_end((sliced_chunk_iterator *)local_80);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar2 = sliced_chunk_iterator::operator*((sliced_chunk_iterator *)local_80);
    if (pCVar2->first == 0x123e) {
      CompareOnTheFlyMaterialProperty(chunk.ctx);
    }
    sliced_chunk_iterator::operator++((sliced_chunk_iterator *)local_80);
  }
  sliced_chunk_iterator::~sliced_chunk_iterator((sliced_chunk_iterator *)local_80);
  sliced_chunk_reader::~sliced_chunk_reader((sliced_chunk_reader *)&it.end);
  scoped_chunk::~scoped_chunk(&local_18);
  return;
}

Assistant:

void CompareOnTheFlyMaterial(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiMaterial");

    comp.cmp<uint32_t>("aiMaterial::mNumProperties");
    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AIMATERIALPROPERTY) {
            CompareOnTheFlyMaterialProperty(comp);
        }
    }
}